

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

enable_if_t<is_olc_db<unodb::olc_db<unodb::key_view,_unodb::value_view>_>,_void> __thiscall
unodb::test::
tree_verifier<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
::
do_insert<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (tree_verifier<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
           *this,key_type k,value_view v)

{
  char *in_R9;
  internal local_78 [8];
  AssertionResult gtest_ar_;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  AssertHelper local_40;
  quiescent_state_on_scope_exit local_34;
  
  local_34.exceptions_at_ctor = std::uncaught_exceptions();
  local_78[0] = (internal)
                olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::insert_internal((olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                                   *)(this + 0x80),(art_key_type)k,v);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!(bool)local_78[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,local_78,(AssertionResult *)"test_db.insert(k, v)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x119,(char *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_48._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  quiescent_state_on_scope_exit::~quiescent_state_on_scope_exit(&local_34);
  return;
}

Assistant:

std::enable_if_t<is_olc_db<Db2>, void> do_insert(key_type k,
                                                   unodb::value_view v) {
    const quiescent_state_on_scope_exit qsbr_after_get{};
    UNODB_ASSERT_TRUE(test_db.insert(k, v));
  }